

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall flexbuffers::Verifier::VerifyRef(Verifier *this,Reference r)

{
  Reference r_00;
  Reference r_01;
  Reference r_02;
  Reference r_03;
  Reference r_04;
  Reference r_05;
  Reference r_06;
  Reference r_07;
  Reference r_08;
  bool bVar1;
  Type type;
  ulong width;
  bool local_fa;
  bool local_f9;
  byte local_e1;
  Type vtype;
  uint8_t len;
  Verifier *local_c8;
  uint8_t *local_c0;
  Verifier *local_b8;
  uint8_t *local_b0;
  Verifier *local_a8;
  uint8_t *local_a0;
  Verifier *local_98;
  uint8_t *local_90;
  Verifier *local_88;
  uint8_t *local_80;
  Verifier *local_78;
  uint8_t *local_70;
  Verifier *local_68;
  uint8_t *local_60;
  Verifier *local_58;
  uint8_t *local_50;
  Verifier *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  uint8_t *p;
  uint64_t off;
  Verifier *this_local;
  Reference r_local;
  
  this_local = (Verifier *)r.data_;
  r_local.data_._1_1_ = r.byte_width_;
  width = (ulong)r_local.data_._1_1_;
  off = (uint64_t)this;
  r_local.data_ = r._8_8_;
  bVar1 = VerifyByteWidth(this,width);
  if (bVar1) {
    bVar1 = VerifyType(this,r_local.data_._4_4_);
    if (bVar1) {
      bVar1 = IsInline(r_local.data_._4_4_);
      if (bVar1) {
        return true;
      }
      p = (uint8_t *)ReadUInt64((uint8_t *)this_local,(uint8_t)r_local.data_);
      bVar1 = VerifyOffset(this,(uint64_t)p,(uint8_t *)this_local);
      if (bVar1) {
        local_38 = Reference::Indirect((Reference *)&this_local);
        bVar1 = VerifyAlignment(this,local_38,(ulong)r_local.data_ >> 8 & 0xff);
        if (bVar1) {
          switch(r_local.data_._4_4_) {
          case FBT_KEY:
            bVar1 = VerifyKey(this,local_38);
            return bVar1;
          case FBT_STRING:
            local_c8 = this_local;
            local_c0 = r_local.data_;
            r_00._8_8_ = r_local.data_;
            r_00.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_00,local_38,FBT_UINT);
            local_fa = false;
            if (bVar1) {
              String::String((String *)&vtype,local_38,r_local.data_._1_1_);
              local_fa = VerifyTerminator(this,(String *)&vtype);
            }
            return local_fa;
          case FBT_INDIRECT_INT:
          case FBT_INDIRECT_UINT:
          case FBT_INDIRECT_FLOAT:
            bVar1 = VerifyFromPointer(this,local_38,(ulong)r_local.data_ >> 8 & 0xff);
            return bVar1;
          case FBT_MAP:
            local_48 = this_local;
            local_40 = r_local.data_;
            r_08._8_8_ = r_local.data_;
            r_08.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_08,local_38,FBT_NULL);
            local_f9 = false;
            if (bVar1) {
              local_f9 = VerifyKeys(this,local_38,r_local.data_._1_1_);
            }
            return local_f9;
          case FBT_VECTOR:
            local_58 = this_local;
            local_50 = r_local.data_;
            r_07._8_8_ = r_local.data_;
            r_07.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_07,local_38,FBT_NULL);
            return bVar1;
          case FBT_VECTOR_INT:
            local_68 = this_local;
            local_60 = r_local.data_;
            r_06._8_8_ = r_local.data_;
            r_06.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_06,local_38,FBT_INT);
            return bVar1;
          case FBT_VECTOR_UINT:
          case FBT_VECTOR_BOOL:
            local_78 = this_local;
            local_70 = r_local.data_;
            r_05._8_8_ = r_local.data_;
            r_05.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_05,local_38,FBT_UINT);
            return bVar1;
          case FBT_VECTOR_FLOAT:
            local_88 = this_local;
            local_80 = r_local.data_;
            r_04._8_8_ = r_local.data_;
            r_04.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_04,local_38,FBT_FLOAT);
            return bVar1;
          case FBT_VECTOR_KEY:
            local_98 = this_local;
            local_90 = r_local.data_;
            r_03._8_8_ = r_local.data_;
            r_03.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_03,local_38,FBT_KEY);
            return bVar1;
          case FBT_VECTOR_STRING_DEPRECATED:
            local_a8 = this_local;
            local_a0 = r_local.data_;
            r_02._8_8_ = r_local.data_;
            r_02.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_02,local_38,FBT_KEY);
            return bVar1;
          case FBT_VECTOR_INT2:
          case FBT_VECTOR_UINT2:
          case FBT_VECTOR_FLOAT2:
          case FBT_VECTOR_INT3:
          case FBT_VECTOR_UINT3:
          case FBT_VECTOR_FLOAT3:
          case FBT_VECTOR_INT4:
          case FBT_VECTOR_UINT4:
          case FBT_VECTOR_FLOAT4:
            goto switchD_0038f785_caseD_10;
          case FBT_BLOB:
            local_b8 = this_local;
            local_b0 = r_local.data_;
            r_01._8_8_ = r_local.data_;
            r_01.data_ = (uint8_t *)this_local;
            bVar1 = VerifyVector(this,r_01,local_38,FBT_UINT);
            return bVar1;
          default:
            return false;
          }
        }
        return false;
      }
      return false;
    }
  }
  return false;
switchD_0038f785_caseD_10:
  local_e1 = 0;
  type = ToFixedTypedVectorElementType(r_local.data_._4_4_,&local_e1);
  bVar1 = VerifyType(this,type);
  if (!bVar1) {
    return false;
  }
  bVar1 = VerifyFromPointer(this,local_38,((ulong)r_local.data_ >> 8 & 0xff) * (ulong)local_e1);
  return bVar1;
}

Assistant:

bool VerifyRef(Reference r) {
    // r.parent_width_ and r.data_ already verified.
    if (!VerifyByteWidth(r.byte_width_) || !VerifyType(r.type_)) {
      return false;
    }
    if (IsInline(r.type_)) {
      // Inline scalars, don't require further verification.
      return true;
    }
    // All remaining types are an offset.
    auto off = ReadUInt64(r.data_, r.parent_width_);
    if (!VerifyOffset(off, r.data_)) return false;
    auto p = r.Indirect();
    if (!VerifyAlignment(p, r.byte_width_)) return false;
    switch (r.type_) {
      case FBT_INDIRECT_INT:
      case FBT_INDIRECT_UINT:
      case FBT_INDIRECT_FLOAT: return VerifyFromPointer(p, r.byte_width_);
      case FBT_KEY: return VerifyKey(p);
      case FBT_MAP:
        return VerifyVector(r, p, FBT_NULL) && VerifyKeys(p, r.byte_width_);
      case FBT_VECTOR: return VerifyVector(r, p, FBT_NULL);
      case FBT_VECTOR_INT: return VerifyVector(r, p, FBT_INT);
      case FBT_VECTOR_BOOL:
      case FBT_VECTOR_UINT: return VerifyVector(r, p, FBT_UINT);
      case FBT_VECTOR_FLOAT: return VerifyVector(r, p, FBT_FLOAT);
      case FBT_VECTOR_KEY: return VerifyVector(r, p, FBT_KEY);
      case FBT_VECTOR_STRING_DEPRECATED:
        // Use of FBT_KEY here intentional, see elsewhere.
        return VerifyVector(r, p, FBT_KEY);
      case FBT_BLOB: return VerifyVector(r, p, FBT_UINT);
      case FBT_STRING:
        return VerifyVector(r, p, FBT_UINT) &&
               VerifyTerminator(String(p, r.byte_width_));
      case FBT_VECTOR_INT2:
      case FBT_VECTOR_UINT2:
      case FBT_VECTOR_FLOAT2:
      case FBT_VECTOR_INT3:
      case FBT_VECTOR_UINT3:
      case FBT_VECTOR_FLOAT3:
      case FBT_VECTOR_INT4:
      case FBT_VECTOR_UINT4:
      case FBT_VECTOR_FLOAT4: {
        uint8_t len = 0;
        auto vtype = ToFixedTypedVectorElementType(r.type_, &len);
        if (!VerifyType(vtype)) return false;
        return VerifyFromPointer(p, static_cast<size_t>(r.byte_width_) * len);
      }
      default: return false;
    }
  }